

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::listen_internal(Server *this)

{
  int iVar1;
  lock_guard<std::mutex> local_60;
  lock_guard<std::mutex> guard;
  duration<long,_std::ratio<1L,_1000L>_> local_50 [3];
  type local_38;
  thread local_28;
  int local_1c;
  int local_18;
  socket_t sock;
  int val;
  bool ret;
  Server *this_local;
  
  sock._3_1_ = 1;
  this->is_running_ = true;
  _val = this;
  do {
    while (local_18 = detail::select_read(this->svr_sock_,0,100000), local_18 == 0) {
      if (this->svr_sock_ == -1) {
LAB_00221fc8:
        do {
          guard._M_device._4_4_ = 10;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1000l>> *)local_50,
                     (int *)((long)&guard._M_device + 4));
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_50);
          std::lock_guard<std::mutex>::lock_guard(&local_60,&this->running_threads_mutex_);
          iVar1 = this->running_threads_;
          std::lock_guard<std::mutex>::~lock_guard(&local_60);
        } while (iVar1 != 0);
        this->is_running_ = false;
        return (bool)(sock._3_1_ & 1);
      }
    }
    local_1c = accept(this->svr_sock_,(sockaddr *)0x0,(socklen_t *)0x0);
    if (local_1c == -1) {
      if (this->svr_sock_ != -1) {
        detail::close_socket(this->svr_sock_);
        sock._3_1_ = 0;
      }
      goto LAB_00221fc8;
    }
    local_38.this = this;
    local_38.sock = local_1c;
    std::thread::thread<httplib::Server::listen_internal()::_lambda()_1_,,void>(&local_28,&local_38)
    ;
    std::thread::detach();
    std::thread::~thread(&local_28);
  } while( true );
}

Assistant:

inline bool Server::listen_internal()
{
    auto ret = true;

    is_running_ = true;

    for (;;) {
        auto val = detail::select_read(svr_sock_, 0, 100000);

        if (val == 0) { // Timeout
            if (svr_sock_ == INVALID_SOCKET) {
                // The server socket was closed by 'stop' method.
                break;
            }
            continue;
        }

        socket_t sock = accept(svr_sock_, NULL, NULL);

        if (sock == INVALID_SOCKET) {
            if (svr_sock_ != INVALID_SOCKET) {
                detail::close_socket(svr_sock_);
                ret = false;
            } else {
                ; // The server socket was closed by user.
            }
            break;
        }

        // TODO: Use thread pool...
        std::thread([=]() {
            {
                std::lock_guard<std::mutex> guard(running_threads_mutex_);
                running_threads_++;
            }

            read_and_close_socket(sock);

            {
                std::lock_guard<std::mutex> guard(running_threads_mutex_);
                running_threads_--;
            }
        }).detach();
    }

    // TODO: Use thread pool...
    for (;;) {
        std::this_thread::sleep_for(std::chrono::milliseconds(10));
        std::lock_guard<std::mutex> guard(running_threads_mutex_);
        if (!running_threads_) {
            break;
        }
    }

    is_running_ = false;

    return ret;
}